

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_insert.cpp
# Opt level: O2

void duckdb::PhysicalInsert::GetInsertInfo
               (BoundCreateTableInfo *info,vector<duckdb::LogicalType,_true> *insert_types)

{
  pointer pCVar1;
  ColumnDefinition *this;
  ColumnListIterator CVar2;
  ColumnLogicalIteratorInternal __begin1;
  ColumnLogicalIteratorInternal __end1;
  ColumnLogicalIteratorInternal local_80;
  ColumnLogicalIteratorInternal local_60;
  LogicalType local_40;
  ColumnListIterator local_28;
  
  pCVar1 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     (&info->base);
  CVar2 = ColumnList::Physical((ColumnList *)&pCVar1[1].catalog.field_2);
  local_28.list = CVar2.list;
  local_28.physical = CVar2.physical;
  ColumnList::ColumnListIterator::begin(&local_80,&local_28);
  ColumnList::ColumnListIterator::end(&local_60,&local_28);
  while (((local_80.pos != local_60.pos || (local_80.end != local_60.end)) ||
         (local_80.list != local_60.list))) {
    this = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*(&local_80);
    ColumnDefinition::GetType(&local_40,this);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
    emplace_back<duckdb::LogicalType>
              (&insert_types->
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,&local_40);
    LogicalType::~LogicalType(&local_40);
    local_80.pos = local_80.pos + 1;
  }
  return;
}

Assistant:

void PhysicalInsert::GetInsertInfo(const BoundCreateTableInfo &info, vector<LogicalType> &insert_types) {
	auto &create_info = info.base->Cast<CreateTableInfo>();
	for (auto &col : create_info.columns.Physical()) {
		insert_types.push_back(col.GetType());
	}
}